

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O0

int BIO_gets(BIO *bp,char *buf,int size)

{
  int ret;
  int len_local;
  char *buf_local;
  BIO *bio_local;
  
  if (((bp == (BIO *)0x0) || (bp->method == (BIO_METHOD *)0x0)) ||
     (bp->method->bgets == (_func_598 *)0x0)) {
    ERR_put_error(0x11,0,0x73,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                  ,0x66);
    bio_local._4_4_ = -2;
  }
  else if (*(int *)&bp->cb_arg == 0) {
    ERR_put_error(0x11,0,0x72,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                  ,0x6a);
    bio_local._4_4_ = -2;
  }
  else if (size < 1) {
    bio_local._4_4_ = 0;
  }
  else {
    bio_local._4_4_ = (*bp->method->bgets)(bp,buf,size);
    if (0 < bio_local._4_4_) {
      bp->next_bio = (bio_st *)((long)&bp->next_bio->method + (long)bio_local._4_4_);
    }
  }
  return bio_local._4_4_;
}

Assistant:

int BIO_gets(BIO *bio, char *buf, int len) {
  if (bio == NULL || bio->method == NULL || bio->method->bgets == NULL) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_UNSUPPORTED_METHOD);
    return -2;
  }
  if (!bio->init) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_UNINITIALIZED);
    return -2;
  }
  if (len <= 0) {
    return 0;
  }
  int ret = bio->method->bgets(bio, buf, len);
  if (ret > 0) {
    bio->num_read += ret;
  }
  return ret;
}